

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
bench::save(bench *this,ostream *os,string *name,
           vector<bench::element,_std::allocator<bench::element>_> *c)

{
  pointer pmVar1;
  pointer pmVar2;
  pointer pmVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,name);
  save_header(this,os,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar1 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pmVar2 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = 0;
  for (lVar5 = 0; lVar5 != ((long)pmVar1 - (long)pmVar2) / 0x28; lVar5 = lVar5 + 1) {
    pmVar3 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_60._M_str = pmVar3[lVar5].m_name._M_dataplus._M_p;
    local_60._M_len = pmVar3[lVar5].m_name._M_string_length;
    ::fmt::v7::print<char[4],std::basic_string_view<char,std::char_traits<char>>,char>
              (os,(char (*) [4])"{},",&local_60);
    lVar4 = 0;
    lVar6 = (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      ::fmt::v7::print<char[9],double&,char>
                (os,(char (*) [9])"{:.10g},",
                 (double *)
                 ((long)(this->array).m_data.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                 lVar4 + (this->array).m_line_size * lVar7));
      lVar4 = lVar4 + 8;
    }
    ::fmt::v7::print<char[9],double_const&,char>
              (os,(char (*) [9])0x5561ef,
               &(c->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar5].solution);
    lVar7 = lVar7 + 8;
  }
  return;
}

Assistant:

void save(std::ostream& os,
              std::string name,
              const std::vector<element>& c)
    {
        save_header(os, name);

        for (std::size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            fmt::print(os, "{},", models[i].name());

            for (std::size_t j{ 0 }, end_j{ solvers.size() }; j != end_j; ++j)
                fmt::print(os, "{:.10g},", array(i, j));

            fmt::print(os, "{:.10g}\n", c[i].solution);
        }
    }